

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,GenericForStatement *gen_for,void *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Instruction IVar5;
  Instruction i;
  Instruction line_00;
  pointer pSVar6;
  Function *this_00;
  long in_RSI;
  CodeGenerateVisitor *in_RDI;
  int index;
  Instruction instruction;
  int index_1;
  int name;
  Instruction instruction_1;
  anon_class_16_2_a46cb335 move;
  int temp_var;
  int temp_state;
  int temp_func;
  int name_end;
  NameListData_conflict name_list_data;
  int name_start;
  Guard g_1;
  Guard l;
  int line;
  Function *function;
  ExpListData_conflict exp_list_data;
  int var_register;
  int state_register;
  int func_register;
  Guard g;
  undefined8 in_stack_fffffffffffffd88;
  OpType in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  Function *in_stack_fffffffffffffd98;
  JumpType in_stack_fffffffffffffda0;
  Instruction in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  CodeGenerateVisitor *in_stack_fffffffffffffdc0;
  CodeGenerateVisitor *this_01;
  int local_1d4;
  NameListData local_1a5 [6];
  CodeGenerateVisitor local_170 [4];
  long local_100;
  undefined4 local_b4;
  Function *local_b0;
  ExpListData local_a8 [2];
  int local_a0;
  int local_9c;
  int local_98;
  long local_10;
  
  local_10 = in_RSI;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::GenericForStatement*,void*)::__0,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd98);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::GenericForStatement*,void*)::__1,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd98);
  Guard::Guard((Guard *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               (function<void_()> *)
               CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0));
  std::function<void_()>::~function((function<void_()> *)0x209321);
  std::function<void_()>::~function((function<void_()> *)0x20932e);
  local_98 = GenerateRegisterId(in_stack_fffffffffffffdc0);
  local_9c = GenerateRegisterId(in_stack_fffffffffffffdc0);
  local_a0 = GenerateRegisterId(in_stack_fffffffffffffdc0);
  ExpListData::ExpListData(local_a8,local_98,local_a0 + 1);
  pSVar6 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x2093af);
  (*pSVar6->_vptr_SyntaxTree[2])(pSVar6,in_RDI,local_a8);
  local_b0 = GetCurrentFunction(in_RDI);
  local_b4 = *(undefined4 *)(local_10 + 0x20);
  local_100 = local_10;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::GenericForStatement*,void*)::__2,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
             (anon_class_16_2_c9614607 *)in_stack_fffffffffffffd98);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::GenericForStatement*,void*)::__3,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd98);
  Guard::Guard((Guard *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               (function<void_()> *)
               CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0));
  std::function<void_()>::~function((function<void_()> *)0x20947e);
  std::function<void_()>::~function((function<void_()> *)0x20948b);
  this_01 = local_170;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::GenericForStatement*,void*)::__4,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd98);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::GenericForStatement*,void*)::__5,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd98);
  Guard::Guard((Guard *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               (function<void_()> *)
               CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0));
  std::function<void_()>::~function((function<void_()> *)0x2094ff);
  std::function<void_()>::~function((function<void_()> *)0x20950c);
  local_1a5[0].name_count_._1_4_ = GetNextRegisterId(in_RDI);
  NameListData::NameListData(local_1a5,false);
  pSVar6 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x209549);
  (*pSVar6->_vptr_SyntaxTree[2])(pSVar6,in_RDI,local_1a5);
  iVar1 = GetNextRegisterId(in_RDI);
  if (local_1a5[0].name_count_._1_4_ < iVar1) {
    iVar2 = GenerateRegisterId(this_01);
    iVar3 = GenerateRegisterId(this_01);
    iVar4 = GenerateRegisterId(this_01);
    Visit::anon_class_16_2_a46cb335::operator()
              ((anon_class_16_2_a46cb335 *)
               CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(int)in_stack_fffffffffffffd98);
    Visit::anon_class_16_2_a46cb335::operator()
              ((anon_class_16_2_a46cb335 *)
               CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(int)in_stack_fffffffffffffd98);
    Visit::anon_class_16_2_a46cb335::operator()
              ((anon_class_16_2_a46cb335 *)
               CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(int)in_stack_fffffffffffffd98);
    IVar5 = Instruction::ABCCode
                      (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                       (int)in_stack_fffffffffffffd88,0);
    Function::AddInstruction
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffda4,in_stack_fffffffffffffd94);
    for (local_1d4 = local_1a5[0].name_count_._1_4_; local_1d4 < iVar1; local_1d4 = local_1d4 + 1) {
      Visit::anon_class_16_2_a46cb335::operator()
                ((anon_class_16_2_a46cb335 *)
                 CONCAT44(in_stack_fffffffffffffda4.opcode_,in_stack_fffffffffffffda0),
                 (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(int)in_stack_fffffffffffffd98);
    }
    i = Instruction::AsBxCode
                  (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                   (int)in_stack_fffffffffffffd88);
    this_00 = (Function *)
              Function::AddInstruction(in_stack_fffffffffffffd98,i,in_stack_fffffffffffffd94);
    AddLoopJumpInfo((CodeGenerateVisitor *)CONCAT44(iVar2,iVar3),
                    (SyntaxTree *)CONCAT44(iVar4,IVar5.opcode_),i.opcode_,in_stack_fffffffffffffda0)
    ;
    Visit::anon_class_16_2_a46cb335::operator()
              ((anon_class_16_2_a46cb335 *)CONCAT44(i.opcode_,in_stack_fffffffffffffda0),
               (int)((ulong)this_00 >> 0x20),(int)this_00);
    pSVar6 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x2098d2);
    (*pSVar6->_vptr_SyntaxTree[2])(pSVar6,in_RDI,0);
    Guard::~Guard((Guard *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    line_00 = Instruction::AsBxCode
                        (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                         (int)in_stack_fffffffffffffd88);
    Function::AddInstruction(this_00,i,line_00.opcode_);
    AddLoopJumpInfo((CodeGenerateVisitor *)CONCAT44(iVar2,iVar3),
                    (SyntaxTree *)CONCAT44(iVar4,IVar5.opcode_),i.opcode_,in_stack_fffffffffffffda0)
    ;
    Guard::~Guard((Guard *)CONCAT44(line_00.opcode_,in_stack_fffffffffffffd90));
    Guard::~Guard((Guard *)CONCAT44(line_00.opcode_,in_stack_fffffffffffffd90));
    return;
  }
  __assert_fail("name_start < name_end",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x3c7,
                "virtual void luna::CodeGenerateVisitor::Visit(GenericForStatement *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(GenericForStatement *gen_for, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

        // Init generic for statement data
        auto func_register = GenerateRegisterId();
        auto state_register = GenerateRegisterId();
        auto var_register = GenerateRegisterId();
        ExpListData exp_list_data{ func_register, var_register + 1 };
        gen_for->exp_list_->Accept(this, &exp_list_data);

        auto function = GetCurrentFunction();
        auto line = gen_for->line_;
        LOOP_GUARD(gen_for);
        {
            CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
            
            // Alloca registers for names
            auto name_start = GetNextRegisterId();
            NameListData name_list_data{ false };
            gen_for->name_list_->Accept(this, &name_list_data);
            auto name_end = GetNextRegisterId();
            assert(name_start < name_end);

            // Alloca temp registers for call iterate function
            auto temp_func = GenerateRegisterId();
            auto temp_state = GenerateRegisterId();
            auto temp_var = GenerateRegisterId();

            // Call iterate function
            auto move = [=](int dst, int src) {
                auto instruction = Instruction::ABCode(OpType_Move, dst, src);
                function->AddInstruction(instruction, line);
            };
            move(temp_func, func_register);
            move(temp_state, state_register);
            move(temp_var, var_register);

            auto instruction = Instruction::ABCCode(OpType_Call, temp_func,
                                                    2 + 1,  // Two args
                                                    name_end - name_start + 1);
            function->AddInstruction(instruction, line);

            // Copy results to registers of names
            for (auto name = name_start; name < name_end; ++name, ++temp_func)
                move(name, temp_func);

            // Break the loop when the first name value is nil
            instruction = Instruction::AsBxCode(OpType_JmpNil, name_start, 0);
            int index = function->AddInstruction(instruction, line);
            AddLoopJumpInfo(gen_for, index, LoopJumpInfo::JumpTail);

            // Copy first name value to var_register
            move(var_register, name_start);

            gen_for->block_->Accept(this, nullptr);
        }
        

        // Jump to loop start
        auto instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, line);
        AddLoopJumpInfo(gen_for, index, LoopJumpInfo::JumpHead);
    }